

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::SonarQubeReporter::writeAssertion
          (SonarQubeReporter *this,AssertionStats *stats,bool okToFail)

{
  StringRef attribute;
  StringRef name;
  bool bVar1;
  OfType OVar2;
  size_type sVar3;
  AssertionResult *this_00;
  ReusableStringStream *pRVar4;
  AssertionResult *this_01;
  XmlWriter *this_02;
  reference pMVar5;
  string *stdString;
  byte in_DL;
  AssertionResult *in_RSI;
  long in_RDI;
  MessageInfo *msg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *__range2;
  ReusableStringStream textRss;
  ReusableStringStream messageRss;
  ScopedElement e;
  string elementName;
  AssertionResult *result;
  string *in_stack_fffffffffffffda8;
  AssertionResult *in_stack_fffffffffffffdb0;
  StringRef *in_stack_fffffffffffffdb8;
  ReusableStringStream *in_stack_fffffffffffffdc0;
  undefined8 in_stack_fffffffffffffdc8;
  XmlFormatting fmt;
  string *in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  AssertionResult *in_stack_fffffffffffffde8;
  string local_1d8 [4];
  XmlFormatting in_stack_fffffffffffffe2c;
  XmlWriter *in_stack_fffffffffffffe30;
  StringRef in_stack_fffffffffffffe38;
  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  local_180;
  AssertionResult *local_178;
  undefined1 local_169;
  StringRef local_168;
  undefined1 local_151;
  string local_150 [39];
  undefined1 local_129;
  string local_128 [39];
  undefined1 local_101;
  string local_f0 [48];
  StringRef local_c0;
  undefined1 local_a9;
  string local_a8 [39];
  undefined1 local_81;
  StringRef local_80;
  string local_40 [32];
  AssertionResult *local_20;
  byte local_11;
  AssertionResult *local_10;
  
  fmt = (XmlFormatting)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
  local_11 = in_DL & 1;
  local_20 = in_RSI;
  local_10 = in_RSI;
  bVar1 = AssertionResult::isOk(in_stack_fffffffffffffdb0);
  if ((bVar1) && (OVar2 = AssertionResult::getResultType(local_20), OVar2 != ExplicitSkip)) {
    return;
  }
  std::__cxx11::string::string(local_40);
  if ((local_11 & 1) != 0) {
    std::__cxx11::string::operator=(local_40,"skipped");
    goto LAB_001aad87;
  }
  OVar2 = AssertionResult::getResultType(local_20);
  if (3 < (uint)(OVar2 + Info)) {
    if (OVar2 == ExplicitSkip) {
      std::__cxx11::string::operator=(local_40,"skipped");
      goto LAB_001aad87;
    }
    if (OVar2 != FailureBit) {
      if ((uint)(OVar2 + ~FailureBit) < 2) {
LAB_001aad3d:
        std::__cxx11::string::operator=(local_40,"failure");
        goto LAB_001aad87;
      }
      if (OVar2 != Exception) {
        if (OVar2 != ThrewException) {
          if (OVar2 == DidntThrowException) goto LAB_001aad3d;
          if (OVar2 != FatalErrorCondition) goto LAB_001aad87;
        }
        std::__cxx11::string::operator=(local_40,"error");
        goto LAB_001aad87;
      }
    }
  }
  std::__cxx11::string::operator=(local_40,"internalError");
LAB_001aad87:
  sVar3 = in_RDI + 0xb0;
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            ((XmlWriter *)CONCAT17(in_stack_fffffffffffffddf,in_stack_fffffffffffffdd8),
             in_stack_fffffffffffffdd0,fmt);
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)in_stack_fffffffffffffdb0);
  local_80 = AssertionResult::getTestMacroName(local_20);
  this_00 = (AssertionResult *)
            ReusableStringStream::operator<<(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  local_81 = 0x28;
  pRVar4 = ReusableStringStream::operator<<
                     ((ReusableStringStream *)in_stack_fffffffffffffdb0,
                      (char *)in_stack_fffffffffffffda8);
  AssertionResult::getExpression_abi_cxx11_(in_stack_fffffffffffffde8);
  this_01 = (AssertionResult *)
            ReusableStringStream::operator<<
                      ((ReusableStringStream *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  local_a9 = 0x29;
  ReusableStringStream::operator<<
            ((ReusableStringStream *)in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  std::__cxx11::string::~string(local_a8);
  this_02 = (XmlWriter *)(in_RDI + 0xb0);
  local_c0 = operator____sr((char *)in_stack_fffffffffffffdb0,(size_t)in_stack_fffffffffffffda8);
  ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffda8);
  StringRef::StringRef((StringRef *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  name.m_size = sVar3;
  name.m_start = (char *)this_00;
  attribute.m_size = (size_type)pRVar4;
  attribute.m_start = (char *)this_01;
  XmlWriter::writeAttribute(this_02,name,attribute);
  std::__cxx11::string::~string(local_f0);
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)in_stack_fffffffffffffdb0);
  OVar2 = AssertionResult::getResultType(local_20);
  if (OVar2 == ExplicitSkip) {
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdb0,
               (char (*) [9])in_stack_fffffffffffffda8);
  }
  else {
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdb0,
               (char (*) [9])in_stack_fffffffffffffda8);
    bVar1 = AssertionResult::hasExpression((AssertionResult *)0x1ab016);
    if (bVar1) {
      local_101 = 9;
      in_stack_fffffffffffffde8 =
           (AssertionResult *)
           ReusableStringStream::operator<<
                     ((ReusableStringStream *)in_stack_fffffffffffffdb0,
                      (char *)in_stack_fffffffffffffda8);
      AssertionResult::getExpressionInMacro_abi_cxx11_(this_01);
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      local_129 = 10;
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8
                );
      std::__cxx11::string::~string(local_128);
    }
    bVar1 = AssertionResult::hasExpandedExpression(this_00);
    if (bVar1) {
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdb0,
                 (char (*) [18])in_stack_fffffffffffffda8);
      AssertionResult::getExpandedExpression_abi_cxx11_(in_stack_fffffffffffffde8);
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      local_151 = 10;
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8
                );
      std::__cxx11::string::~string(local_150);
    }
  }
  bVar1 = AssertionResult::hasMessage((AssertionResult *)0x1ab18f);
  if (bVar1) {
    local_168 = AssertionResult::getMessage((AssertionResult *)0x1ab1a2);
    ReusableStringStream::operator<<(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
    local_169 = 10;
    ReusableStringStream::operator<<
              ((ReusableStringStream *)in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8);
  }
  local_178 = local_10 + 1;
  local_180._M_current =
       (MessageInfo *)
       std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                 ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
                  in_stack_fffffffffffffda8);
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)
             in_stack_fffffffffffffda8);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                             *)in_stack_fffffffffffffdb0,
                            (__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                             *)in_stack_fffffffffffffda8), bVar1) {
    pMVar5 = __gnu_cxx::
             __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
             ::operator*(&local_180);
    if (pMVar5->type == Info) {
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
      ReusableStringStream::operator<<
                ((ReusableStringStream *)in_stack_fffffffffffffdb0,(char *)in_stack_fffffffffffffda8
                );
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
    ::operator++(&local_180);
  }
  pRVar4 = ReusableStringStream::operator<<
                     ((ReusableStringStream *)in_stack_fffffffffffffdb0,
                      (char (*) [4])in_stack_fffffffffffffda8);
  AssertionResult::getSourceInfo(local_20);
  ReusableStringStream::operator<<(pRVar4,(SourceLineInfo *)in_stack_fffffffffffffda8);
  stdString = (string *)(in_RDI + 0xb0);
  ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)stdString);
  StringRef::StringRef((StringRef *)pRVar4,stdString);
  XmlWriter::writeText
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe38,in_stack_fffffffffffffe2c);
  std::__cxx11::string::~string(local_1d8);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)this_02);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)this_02);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)pRVar4);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void SonarQubeReporter::writeAssertion(AssertionStats const& stats, bool okToFail) {
        AssertionResult const& result = stats.assertionResult;
        if ( !result.isOk() ||
             result.getResultType() == ResultWas::ExplicitSkip ) {
            std::string elementName;
            if (okToFail) {
                elementName = "skipped";
            } else {
                switch (result.getResultType()) {
                case ResultWas::ThrewException:
                case ResultWas::FatalErrorCondition:
                    elementName = "error";
                    break;
                case ResultWas::ExplicitFailure:
                case ResultWas::ExpressionFailed:
                case ResultWas::DidntThrowException:
                    elementName = "failure";
                    break;
                case ResultWas::ExplicitSkip:
                    elementName = "skipped";
                    break;
                    // We should never see these here:
                case ResultWas::Info:
                case ResultWas::Warning:
                case ResultWas::Ok:
                case ResultWas::Unknown:
                case ResultWas::FailureBit:
                case ResultWas::Exception:
                    elementName = "internalError";
                    break;
                }
            }

            XmlWriter::ScopedElement e = xml.scopedElement(elementName);

            ReusableStringStream messageRss;
            messageRss << result.getTestMacroName() << '(' << result.getExpression() << ')';
            xml.writeAttribute("message"_sr, messageRss.str());

            ReusableStringStream textRss;
            if ( result.getResultType() == ResultWas::ExplicitSkip ) {
                textRss << "SKIPPED\n";
            } else {
                textRss << "FAILED:\n";
                if (result.hasExpression()) {
                    textRss << '\t' << result.getExpressionInMacro() << '\n';
                }
                if (result.hasExpandedExpression()) {
                    textRss << "with expansion:\n\t" << result.getExpandedExpression() << '\n';
                }
            }

            if (result.hasMessage())
                textRss << result.getMessage() << '\n';

            for (auto const& msg : stats.infoMessages)
                if (msg.type == ResultWas::Info)
                    textRss << msg.message << '\n';

            textRss << "at " << result.getSourceInfo();
            xml.writeText(textRss.str(), XmlFormatting::Newline);
        }
    }